

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# showref.cpp
# Opt level: O2

bool __thiscall duckdb::ShowRef::Equals(ShowRef *this,TableRef *other_p)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  ShowRef *pSVar4;
  pointer pQVar5;
  
  bVar1 = TableRef::Equals(&this->super_TableRef,other_p);
  if (bVar1) {
    pSVar4 = TableRef::Cast<duckdb::ShowRef>(other_p);
    if ((pSVar4->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
        ._M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t
        .super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl !=
        (this->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
        _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
        super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl) {
      pQVar5 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::
               operator->(&pSVar4->query);
      iVar3 = (*pQVar5->_vptr_QueryNode[4])
                        (pQVar5,(this->query).
                                super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                                .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl);
      if ((char)iVar3 == '\0') goto LAB_01347b76;
    }
    _Var2 = ::std::operator==(&this->table_name,&pSVar4->table_name);
    bVar1 = this->show_type == pSVar4->show_type && _Var2;
  }
  else {
LAB_01347b76:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ShowRef::Equals(const TableRef &other_p) const {
	if (!TableRef::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<ShowRef>();
	if (other.query.get() != query.get()) {
		if (!other.query->Equals(query.get())) {
			return false;
		}
	}
	return table_name == other.table_name && show_type == other.show_type;
}